

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9FFTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  Gia_Man_t *pG;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  char *local_88;
  Gia_Man_t *pGold;
  Bmc_ParFf_t Pars;
  
  pGold = (Gia_Man_t *)0x0;
  Gia_ParFfSetDefault(&Pars);
  local_88 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_0021a47c:
  iVar2 = Extra_UtilGetopt(argc,argv,"ATNKSGkbsfdeunvh");
  iVar1 = globalUtilOptind;
  switch(iVar2) {
  case 0x62:
    Pars.fBasic = Pars.fBasic ^ 1;
    goto LAB_0021a47c;
  case 99:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6c:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
    goto switchD_0021a498_caseD_63;
  case 100:
    Pars.fDump = Pars.fDump ^ 1;
    goto LAB_0021a47c;
  case 0x65:
    Pars.fDumpDelay = Pars.fDumpDelay ^ 1;
    goto LAB_0021a47c;
  case 0x66:
    Pars.fFfOnly = Pars.fFfOnly ^ 1;
    goto LAB_0021a47c;
  case 0x6b:
    Pars.fNonStrict = Pars.fNonStrict ^ 1;
    goto LAB_0021a47c;
  case 0x6e:
    Pars.fDumpNewFaults = Pars.fDumpNewFaults ^ 1;
    goto LAB_0021a47c;
  case 0x73:
    Pars.fStartPats = Pars.fStartPats ^ 1;
    goto LAB_0021a47c;
  case 0x75:
    Pars.fDumpUntest = Pars.fDumpUntest ^ 1;
    goto LAB_0021a47c;
  case 0x76:
    Pars.fVerbose = Pars.fVerbose ^ 1;
    goto LAB_0021a47c;
  }
  switch(iVar2) {
  case 0x4b:
    if (globalUtilOptind < argc) {
      Pars.nCardConstr = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar1 + 1;
      if (Pars.nCardConstr < 1) goto switchD_0021a498_caseD_63;
      goto LAB_0021a47c;
    }
    pcVar4 = "Command line switch \"-K\" should be followed by an integer.\n";
    break;
  case 0x4c:
  case 0x4d:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
    goto switchD_0021a498_caseD_63;
  case 0x4e:
    if (globalUtilOptind < argc) {
      iVar2 = atoi(argv[globalUtilOptind]);
      Pars.nIterCheck = iVar2;
LAB_0021a5a7:
      globalUtilOptind = iVar1 + 1;
      if (iVar2 < 0) goto switchD_0021a498_caseD_63;
      goto LAB_0021a47c;
    }
    pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      Pars.pFormStr = argv[globalUtilOptind];
LAB_0021a56e:
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0021a47c;
    }
    pcVar4 = "Command line switch \"-S\" should be followed by string.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      iVar2 = atoi(argv[globalUtilOptind]);
      Pars.nTimeOut = iVar2;
      goto LAB_0021a5a7;
    }
    pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
    break;
  default:
    if (iVar2 != 0x41) {
      if (iVar2 == 0x47) {
        if (globalUtilOptind < argc) {
          local_88 = argv[globalUtilOptind];
          goto LAB_0021a56e;
        }
        pcVar4 = "Command line switch \"-G\" should be followed by string.\n";
        break;
      }
      if (iVar2 == -1) {
        if (Pars.pFormStr == (char *)0x0 && Pars.Algo == 0) {
          pcVar4 = "Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n";
        }
        else {
          if (Pars.Algo != 0 && Pars.pFormStr != (char *)0x0) {
            pcVar4 = "Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n";
            goto LAB_0021a9d8;
          }
          if (globalUtilOptind + 1 == argc) {
            Pars.pFileName = argv[globalUtilOptind];
            pFVar3 = fopen(Pars.pFileName,"r");
            if (pFVar3 == (FILE *)0x0) {
              pcVar4 = "Cannot open file \"%s\" with the input test patterns.\n";
              local_88 = Pars.pFileName;
              goto LAB_0021aaea;
            }
            fclose(pFVar3);
          }
          pGVar5 = pAbc->pGia;
          if (pGVar5 == (Gia_Man_t *)0x0) {
            pcVar4 = "Abc_CommandAbc9FFTest(): There is no AIG.\n";
          }
          else if ((pGVar5->nRegs == 0) && (Pars.Algo == 1)) {
            pcVar4 = "Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n";
          }
          else {
            if (local_88 == (char *)0x0) {
              pG = (Gia_Man_t *)0x0;
LAB_0021aaba:
              if (pG == (Gia_Man_t *)0x0) {
                pG = pGVar5;
              }
              Gia_ManFaultTest(pGVar5,pG,&Pars);
              Gia_ManStopP(&pGold);
              return 0;
            }
            pFVar3 = fopen(local_88,"r");
            if (pFVar3 == (FILE *)0x0) {
              pcVar4 = "Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n";
LAB_0021aaea:
              Abc_Print(-1,pcVar4,local_88);
              return 0;
            }
            fclose(pFVar3);
            pGold = Gia_AigerRead(local_88,0,0);
            if (pGold == (Gia_Man_t *)0x0) {
              Abc_Print(-1,"Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n",
                        local_88);
              return 0;
            }
            pGVar5 = pAbc->pGia;
            if (pGVar5->vCis->nSize - pGVar5->nRegs == pGold->vCis->nSize - pGold->nRegs) {
              if (pGVar5->vCos->nSize - pGVar5->nRegs == pGold->vCos->nSize - pGold->nRegs) {
                printf("Entered spec AIG from file \"%s\".\n",local_88);
                pGVar5 = pAbc->pGia;
                pG = pGold;
                goto LAB_0021aaba;
              }
              Gia_ManStop(pGold);
              pcVar4 = 
              "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n";
            }
            else {
              Gia_ManStop(pGold);
              pcVar4 = 
              "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n";
            }
          }
        }
LAB_0021a9d8:
        Abc_Print(-1,pcVar4);
        return 0;
      }
      goto switchD_0021a498_caseD_63;
    }
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-A\" should be followed by an integer.\n";
      break;
    }
    Pars.Algo = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar1 + 1;
    if (4 < (uint)Pars.Algo) {
switchD_0021a498_caseD_63:
      Abc_Print(-2,"usage: &fftest [-ATNK num] [-kbsfdeunvh] <file> [-G file] [-S str]\n");
      Abc_Print(-2,"\t          performs functional fault test generation\n");
      Abc_Print(-2,"\t-A num  : selects fault model for all gates [default = %d]\n",
                (ulong)(uint)Pars.Algo);
      Abc_Print(-2,"\t                0: fault model is not selected (use -S str)\n");
      Abc_Print(-2,"\t                1: delay fault testing for sequential circuits\n");
      Abc_Print(-2,"\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n");
      Abc_Print(-2,"\t                3: complement fault: -S ((a&b)^p)\n");
      Abc_Print(-2,"\t                4: functionally observable fault\n");
      Abc_Print(-2,"\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)Pars.nTimeOut);
      Abc_Print(-2,"\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",
                (ulong)(uint)Pars.nIterCheck);
      Abc_Print(-2,"\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n");
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (Pars.fNonStrict == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (Pars.fBasic == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (Pars.fStartPats == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (Pars.fFfOnly == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (Pars.fDump == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-d      : toggles dumping test patterns into file \"tests.txt\" [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (Pars.fDumpDelay == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (Pars.fDumpUntest == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-u      : toggles dumping untestable faults into \"untest.txt\" [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (Pars.fDumpNewFaults == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n"
                ,pcVar4);
      if (Pars.fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v      : toggles printing verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      Abc_Print(-2,"\t<file>  : (optional) file name with input test patterns\n\n");
      Abc_Print(-2,"\t-G file : (optional) file name with the golden model\n\n");
      Abc_Print(-2,"\t-S str  : (optional) string representing the fault model\n");
      Abc_Print(-2,"\t          The following notations are used:\n");
      Abc_Print(-2,"\t            Functional variables: {a,b} (both a and b are always present)\n");
      Abc_Print(-2,"\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n"
               );
      Abc_Print(-2,"\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
      Abc_Print(-2,
                "\t            Parentheses should be used around each operator. Spaces not allowed.\n"
               );
      Abc_Print(-2,
                "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n"
               );
      Abc_Print(-2,"\t            Examples:\n");
      Abc_Print(-2,"\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
      Abc_Print(-2,"\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
      Abc_Print(-2,
                "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n"
               );
      Abc_Print(-2,
                "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n"
               );
      Abc_Print(-2,"\t              ((a&b)^p)             complement at the output\n");
      Abc_Print(-2,
                "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n"
               );
      Abc_Print(-2,
                "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n"
               );
      Abc_Print(-2,"\t              (p?(a|b):(a&b))       replace AND by OR\n");
      return 1;
    }
    goto LAB_0021a47c;
  }
  Abc_Print(-1,pcVar4);
  goto switchD_0021a498_caseD_63;
}

Assistant:

int Abc_CommandAbc9FFTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ParFfSetDefault( Bmc_ParFf_t * p );
    extern void Gia_ManFaultTest( Gia_Man_t * p, Gia_Man_t * pG, Bmc_ParFf_t * pPars );
    Bmc_ParFf_t Pars, * pPars = &Pars;
    char * pFileName = NULL;
    Gia_Man_t * pGold = NULL;
    int c;
    Gia_ParFfSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ATNKSGkbsfdeunvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->Algo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Algo < 0 || pPars->Algo > 4 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterCheck = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterCheck < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCardConstr = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCardConstr <= 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                goto usage;
            }
            pPars->pFormStr = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by string.\n" );
                goto usage;
            }
            pFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'k':
            pPars->fNonStrict ^= 1;
            break;
        case 'b':
            pPars->fBasic ^= 1;
            break;
        case 's':
            pPars->fStartPats ^= 1;
            break;
        case 'f':
            pPars->fFfOnly ^= 1;
            break;
        case 'd':
            pPars->fDump ^= 1;
            break;
        case 'e':
            pPars->fDumpDelay ^= 1;
            break;
        case 'u':
            pPars->fDumpUntest ^= 1;
            break;
        case 'n':
            pPars->fDumpNewFaults ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->Algo == 0 && pPars->pFormStr == NULL )
    {
        Abc_Print( -1, "Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n" );
        return 0;
    }
    if ( pPars->Algo != 0 && pPars->pFormStr != NULL )
    {
        Abc_Print( -1, "Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n" );
        return 0;
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        FILE * pFile;
        pPars->pFileName = argv[globalUtilOptind];
        pFile = fopen( pPars->pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open file \"%s\" with the input test patterns.\n", pPars->pFileName );
            return 0;
        }
        fclose( pFile );
    }
    // check other conditions
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 && pPars->Algo == 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n" );
        return 0;
    }
    // check if the file is valid
    if ( pFileName )
    {
        FILE * pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n", pFileName );
            return 0;
        }
        fclose( pFile );
        pGold = Gia_AigerRead( pFileName, 0, 0 );
        if ( pGold == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n", pFileName );
            return 0;
        }
        if ( Gia_ManPiNum(pAbc->pGia) != Gia_ManPiNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n" );
            return 0;
        }
        if ( Gia_ManPoNum(pAbc->pGia) != Gia_ManPoNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n" );
            return 0;
        }
        printf( "Entered spec AIG from file \"%s\".\n", pFileName );
    }
    Gia_ManFaultTest( pAbc->pGia, pGold ? pGold : pAbc->pGia, pPars );
    Gia_ManStopP( &pGold );
    return 0;

usage:
    Abc_Print( -2, "usage: &fftest [-ATNK num] [-kbsfdeunvh] <file> [-G file] [-S str]\n" );
    Abc_Print( -2, "\t          performs functional fault test generation\n" );
    Abc_Print( -2, "\t-A num  : selects fault model for all gates [default = %d]\n", pPars->Algo );
    Abc_Print( -2, "\t                0: fault model is not selected (use -S str)\n" );
    Abc_Print( -2, "\t                1: delay fault testing for sequential circuits\n" );
    Abc_Print( -2, "\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n" );
    Abc_Print( -2, "\t                3: complement fault: -S ((a&b)^p)\n" );
    Abc_Print( -2, "\t                4: functionally observable fault\n" );
    Abc_Print( -2, "\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",        pPars->nTimeOut );
    Abc_Print( -2, "\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",     pPars->nIterCheck );
    Abc_Print( -2, "\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n" );
    Abc_Print( -2, "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n",pPars->fNonStrict?  "yes": "no" );
    Abc_Print( -2, "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n", pPars->fBasic?      "yes": "no" );
    Abc_Print( -2, "\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n",    pPars->fStartPats?  "yes": "no" );
    Abc_Print( -2, "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n",          pPars->fFfOnly?     "yes": "no" );
    Abc_Print( -2, "\t-d      : toggles dumping test patterns into file \"tests.txt\" [default = %s]\n", pPars->fDump?       "yes": "no" );
    Abc_Print( -2, "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n", pPars->fDumpDelay? "yes": "no" );
    Abc_Print( -2, "\t-u      : toggles dumping untestable faults into \"untest.txt\" [default = %s]\n", pPars->fDumpUntest? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n", pPars->fDumpNewFaults? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggles printing verbose information [default = %s]\n",                  pPars->fVerbose?    "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file>  : (optional) file name with input test patterns\n\n");
    Abc_Print( -2, "\t-G file : (optional) file name with the golden model\n\n");
    Abc_Print( -2, "\t-S str  : (optional) string representing the fault model\n");
    Abc_Print( -2, "\t          The following notations are used:\n");
    Abc_Print( -2, "\t            Functional variables: {a,b} (both a and b are always present)\n");
    Abc_Print( -2, "\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n");
    Abc_Print( -2, "\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
    Abc_Print( -2, "\t            Parentheses should be used around each operator. Spaces not allowed.\n");
    Abc_Print( -2, "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n");
    Abc_Print( -2, "\t            Examples:\n");
    Abc_Print( -2, "\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
    Abc_Print( -2, "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n");
    Abc_Print( -2, "\t              ((a&b)^p)             complement at the output\n");
    Abc_Print( -2, "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n");
    Abc_Print( -2, "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n");
    Abc_Print( -2, "\t              (p?(a|b):(a&b))       replace AND by OR\n");    
    return 1;
}